

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystem::BuildSystem
          (BuildSystem *this,BuildSystemDelegate *delegate,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *fileSystem)

{
  FileSystem *pFVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x138);
  pFVar1 = (fileSystem->_M_t).
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  (fileSystem->_M_t).
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  *puVar2 = this;
  puVar2[1] = delegate;
  puVar2[2] = pFVar1;
  puVar2[3] = puVar2 + 5;
  puVar2[4] = 0;
  *(undefined1 *)(puVar2 + 5) = 0;
  puVar2[7] = &PTR__BuildSystemFileDelegate_00211df0;
  puVar2[8] = puVar2;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0x1000000000;
  puVar2[0xd] = 0;
  puVar2[0xe] = &PTR__BuildSystemEngineDelegate_00212980;
  puVar2[0xf] = puVar2;
  puVar2[0x10] = puVar2 + 0x16;
  puVar2[0x11] = 1;
  puVar2[0x12] = 0;
  puVar2[0x13] = 0;
  *(undefined4 *)(puVar2 + 0x14) = 0x3f800000;
  puVar2[0x15] = 0;
  puVar2[0x16] = 0;
  puVar2[0x17] = puVar2 + 0x1d;
  puVar2[0x18] = 1;
  puVar2[0x19] = 0;
  puVar2[0x1a] = 0;
  *(undefined4 *)(puVar2 + 0x1b) = 0x3f800000;
  puVar2[0x20] = 0;
  puVar2[0x1e] = 0;
  puVar2[0x1f] = 0;
  puVar2[0x1c] = 0;
  puVar2[0x1d] = 0;
  llbuild::core::BuildEngine::BuildEngine
            ((BuildEngine *)(puVar2 + 0x21),(BuildEngineDelegate *)(puVar2 + 0xe));
  *(undefined1 *)(puVar2 + 0x22) = 0;
  puVar2[0x23] = 0;
  puVar2[0x24] = 0;
  puVar2[0x25] = 0x1000000000;
  this->impl = puVar2;
  return;
}

Assistant:

BuildSystem::BuildSystem(BuildSystemDelegate& delegate, std::unique_ptr<basic::FileSystem> fileSystem)
  : impl(new BuildSystemImpl(*this, delegate, std::move(fileSystem)))
{
}